

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Patterns.cpp
# Opt level: O1

Pattern * slang::ast::WildcardPattern::fromSyntax(WildcardPatternSyntax *syntax,ASTContext *context)

{
  Compilation *this;
  Pattern *pPVar1;
  SourceRange local_18;
  
  this = ((context->scope).ptr)->compilation;
  local_18 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  pPVar1 = &BumpAllocator::emplace<slang::ast::WildcardPattern,slang::SourceRange>
                      (&this->super_BumpAllocator,&local_18)->super_Pattern;
  return pPVar1;
}

Assistant:

Pattern& ConstantPattern::fromSyntax(const ExpressionPatternSyntax& syntax, const Type& targetType,
                                     const ASTContext& context) {
    // Bind the expression (it must be a constant).
    // We force integral types to be four-state here so that if we need to do a casex / casez
    // condition we will get the right result for unknowns.
    auto& comp = context.getCompilation();
    const Type* type = &targetType;
    if (type->isIntegral() && !type->isFourState()) {
        auto flags = type->getIntegralFlags() | IntegralFlags::FourState;
        type = &comp.getType(type->getBitWidth(), flags);
    }

    auto& expr = Expression::bindRValue(*type, *syntax.expr, {}, context);
    if (expr.bad() || !context.eval(expr))
        return badPattern(comp, nullptr);

    return *comp.emplace<ConstantPattern>(expr, syntax.sourceRange());
}